

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AcceptanceTests_Load_Test>::
~ParameterizedTestFactory
          (ParameterizedTestFactory<(anonymous_namespace)::AcceptanceTests_Load_Test> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_001a6b40;
  std::vector<(anonymous_namespace)::Assertion,_std::allocator<(anonymous_namespace)::Assertion>_>::
  ~vector(&(this->parameter_).assertions);
  pcVar2 = (this->parameter_).ccs._M_dataplus._M_p;
  paVar1 = &(this->parameter_).ccs.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->parameter_).name._M_dataplus._M_p;
  paVar1 = &(this->parameter_).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter) :
      parameter_(parameter) {}